

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnFuncType
          (BinaryReaderObjdump *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  bool bVar1;
  uint local_40;
  uint local_3c;
  Index i_1;
  Index i;
  Type *result_types_local;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  bVar1 = ShouldPrintDetails(this);
  if (bVar1) {
    printf(" - type[%u] (");
    for (local_3c = 0; local_3c < param_count; local_3c = local_3c + 1) {
      if (local_3c != 0) {
        printf(", ");
      }
      Type::GetName(param_types + local_3c);
      printf("%s");
    }
    printf(") -> ");
    if (result_count == 0) {
      printf("nil");
    }
    else if (result_count == 1) {
      Type::GetName(result_types);
      printf("%s");
    }
    else {
      printf("(");
      for (local_40 = 0; local_40 < result_count; local_40 = local_40 + 1) {
        if (local_40 != 0) {
          printf(", ");
        }
        Type::GetName(result_types + local_40);
        printf("%s");
      }
      printf(")");
    }
    printf("\n");
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (", index);
  for (Index i = 0; i < param_count; i++) {
    if (i != 0) {
      printf(", ");
    }
    printf("%s", param_types[i].GetName());
  }
  printf(") -> ");
  switch (result_count) {
    case 0:
      printf("nil");
      break;
    case 1:
      printf("%s", result_types[0].GetName());
      break;
    default:
      printf("(");
      for (Index i = 0; i < result_count; i++) {
        if (i != 0) {
          printf(", ");
        }
        printf("%s", result_types[i].GetName());
      }
      printf(")");
      break;
  }
  printf("\n");
  return Result::Ok;
}